

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_write_record
                    (ion_fpos_t record_loc,ion_byte_t *key,ion_byte_t *value,ion_byte_t *status,
                    linear_hash_table_t *linear_hash)

{
  FILE *__s;
  long lVar1;
  ion_byte_t *piVar2;
  int iVar3;
  size_t sVar4;
  undefined1 *puVar5;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  undefined1 *local_40;
  ion_byte_t *record;
  linear_hash_table_t *linear_hash_local;
  ion_byte_t *status_local;
  ion_byte_t *value_local;
  ion_byte_t *key_local;
  ion_fpos_t record_loc_local;
  
  if (linear_hash->database == (FILE *)0x0) {
    record_loc_local._7_1_ = '\n';
  }
  else {
    uStack_50 = 0x1130f3;
    record = (ion_byte_t *)linear_hash;
    linear_hash_local = (linear_hash_table_t *)status;
    status_local = value;
    value_local = key;
    key_local = (ion_byte_t *)record_loc;
    iVar3 = fseek((FILE *)linear_hash->database,record_loc,0);
    if (iVar3 == 0) {
      lVar1 = -(*(long *)(record + 0x40) + 0xfU & 0xfffffffffffffff0);
      local_40 = auStack_48 + lVar1;
      *local_40 = (char)(linear_hash_local->super).key_type;
      piVar2 = value_local;
      puVar5 = local_40 + 1;
      iVar3 = *(int *)(record + 4);
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113146;
      memcpy(puVar5,piVar2,(long)iVar3);
      piVar2 = status_local;
      puVar5 = local_40 + (long)*(int *)(record + 4) + 1;
      iVar3 = *(int *)(record + 8);
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x11316a;
      memcpy(puVar5,piVar2,(long)iVar3);
      puVar5 = local_40;
      sVar4 = *(size_t *)(record + 0x40);
      __s = *(FILE **)(record + 0x48);
      *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x113188;
      sVar4 = fwrite(puVar5,sVar4,1,__s);
      if (sVar4 == 1) {
        record_loc_local._7_1_ = '\0';
      }
      else {
        record_loc_local._7_1_ = '\a';
      }
    }
    else {
      record_loc_local._7_1_ = '\r';
    }
  }
  return record_loc_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_write_record(
	ion_fpos_t			record_loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* check the file is open */
	if (!linear_hash->database) {
		return err_file_close_error;
	}

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, record_loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	ion_byte_t *record = alloca(linear_hash->record_total_size);

	memcpy(record, status, sizeof(*status));
	memcpy(record + sizeof(*status), key, linear_hash->super.record.key_size);
	memcpy(record + linear_hash->super.record.key_size + sizeof(*status), value, linear_hash->super.record.value_size);

	if (1 != fwrite(record, linear_hash->record_total_size, 1, linear_hash->database)) {
		return err_file_write_error;
	}

	return err_ok;
}